

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

void __thiscall
CircularDependencyTest2_Test9_Test::~CircularDependencyTest2_Test9_Test
          (CircularDependencyTest2_Test9_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CircularDependencyTest2, Test9){
    Infector::Container ioc;
    ioc.bindSingleAsNothing<KaaaVS>();
    ioc.bindSingleAsNothing<BooomVS>();

    bool ex1=false;
    bool ex2=false;

    try{
        ioc.wire<KaaaVS,BooomVS>();
        ioc.wire<BooomVS,KaaaVS>();
    }catch(std::exception &ex){
        ex1 = true;
        std::cout<<"ex1"<<std::endl;
        std::cout<<ex.what()<<std::endl;
    }

    try{
        auto kaboom = ioc.buildSingle<KaaaVS>();
    }
    catch(std::exception &ex){
        ex2 = true;
        std::cout<<"ex2"<<std::endl;
        std::cout<<ex.what()<<std::endl;
    }

    EXPECT_TRUE(ex1);
    EXPECT_TRUE(ex2);
}